

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

void tchecker::from_string(clock_constraint_container_t *c,clock_variables_t *clocks,string *str)

{
  bool bVar1;
  invalid_argument *piVar2;
  clock_constraints_visitor_t v;
  shared_ptr<tchecker::typed_expression_t> typed_expr;
  shared_ptr<tchecker::expression_t> expr;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  integer_variables_t no_integer_variables;
  
  bVar1 = std::operator==(str,"");
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&no_integer_variables,"",(allocator<char> *)&v);
    parsing::parse_expression((parsing *)&expr,(string *)&no_integer_variables,str);
    std::__cxx11::string::~string((string *)&no_integer_variables);
    if (expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &no_integer_variables,"syntax error in ",str);
      std::invalid_argument::invalid_argument(piVar2,(string *)&no_integer_variables);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    memset(&no_integer_variables,0,0xa0);
    local_f8._M_unused._M_object = (void *)0x0;
    local_f8._8_8_ = 0;
    local_e0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc:292:27)>
               ::_M_invoke;
    local_e8 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/variables/clocks.cc:292:27)>
               ::_M_manager;
    typecheck((tchecker *)&typed_expr,
              expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              &no_integer_variables,&no_integer_variables,clocks,
              (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)&local_f8);
    std::_Function_base::~_Function_base((_Function_base *)&local_f8);
    if (typed_expr.super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                     "type error in expression ",str);
      std::invalid_argument::invalid_argument(piVar2,(string *)&v);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    v.super_typed_expression_visitor_t._vptr_typed_expression_visitor_t =
         (_func_int **)&PTR__typed_expression_visitor_t_001f3770;
    v._c = c;
    (**(code **)(*(long *)typed_expr.
                          super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x30))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&typed_expr.
                super___shared_ptr<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~array_variables_t
              (&no_integer_variables.
                super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&expr.super___shared_ptr<tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void from_string(tchecker::clock_constraint_container_t & c, tchecker::clock_variables_t const & clocks,
                 std::string const & str)
{
  if (str == "")
    return;

  // parse str as a typed expression
  std::shared_ptr<tchecker::expression_t> expr{tchecker::parsing::parse_expression("", str)};
  if (expr.get() == nullptr)
    throw std::invalid_argument("syntax error in " + str);

  tchecker::integer_variables_t no_integer_variables;
  std::shared_ptr<tchecker::typed_expression_t> typed_expr{
      tchecker::typecheck(*expr, no_integer_variables, no_integer_variables, clocks,
                          [](std::string const & err) { std::cerr << tchecker::log_error << err << std::endl; })};
  if (typed_expr.get() == nullptr)
    throw std::invalid_argument("type error in expression " + str);

  // instantiate a typed expression visitor, add each clock constraint from expression to c
  try {
    tchecker::clock_constraints_visitor_t v(c);
    typed_expr->visit(v);
  }
  catch (...) {
    throw std::invalid_argument("error in " + str);
  }
}